

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O0

void Abc_QuickSort2Dec_rec(word *pData,int l,int r)

{
  word wVar1;
  word wVar2;
  int iVar3;
  word t_1;
  word t;
  int j;
  int i;
  word v;
  int r_local;
  int l_local;
  word *pData_local;
  
  wVar1 = pData[r];
  if (l < r) {
    if (r <= l) {
      __assert_fail("l < r",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilSort.c"
                    ,0x23a,"void Abc_QuickSort2Dec_rec(word *, int, int)");
    }
    iVar3 = l + -1;
    t._0_4_ = r;
    if (r - l < 10) {
      Abc_SelectSortDec(pData + l,(r - l) + 1);
    }
    else {
LAB_00592ce8:
      do {
        t._4_4_ = iVar3;
        iVar3 = t._4_4_ + 1;
      } while ((uint)wVar1 < (uint)pData[iVar3]);
      do {
        t._0_4_ = (int)t + -1;
        if ((uint)wVar1 <= (uint)pData[(int)t]) break;
      } while ((int)t != l);
      if (iVar3 < (int)t) {
        wVar2 = pData[iVar3];
        pData[iVar3] = pData[(int)t];
        pData[(int)t] = wVar2;
        goto LAB_00592ce8;
      }
      wVar1 = pData[iVar3];
      pData[iVar3] = pData[r];
      pData[r] = wVar1;
      Abc_QuickSort2Dec_rec(pData,l,t._4_4_);
      Abc_QuickSort2Dec_rec(pData,t._4_4_ + 2,r);
    }
  }
  return;
}

Assistant:

void Abc_QuickSort2Dec_rec( word * pData, int l, int r )
{
    word v = pData[r];
    int i = l-1, j = r;
    if ( l >= r )
        return;
    assert( l < r );
    if ( r - l < 10 )
    {
        Abc_SelectSortDec( pData + l, r - l + 1 );
        return;
    }
    while ( 1 )
    {
        while ( (unsigned)pData[++i] > (unsigned)v );
        while ( (unsigned)v > (unsigned)pData[--j] )
            if ( j == l )
                break;
        if ( i >= j )
            break;
        ABC_SWAP( word, pData[i], pData[j] );
    }
    ABC_SWAP( word, pData[i], pData[r] ); 
    Abc_QuickSort2Dec_rec( pData, l, i-1 );
    Abc_QuickSort2Dec_rec( pData, i+1, r );
}